

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void apu_synchronize(Emulator *e)

{
  u8 *puVar1;
  int *piVar2;
  u8 uVar3;
  SweepDirection SVar4;
  uint uVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  short sVar10;
  u32 uVar11;
  uint uVar12;
  ulong uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  u32 uVar17;
  ushort uVar18;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  byte bVar25;
  byte bVar26;
  u32 total_frames;
  ushort uVar27;
  bool bVar28;
  int local_48;
  
  uVar8 = (e->state).ticks;
  uVar13 = (e->state).apu.sync_ticks;
  if (uVar13 < uVar8) {
    uVar23 = (int)uVar8 - (int)uVar13;
    if ((e->state).apu.enabled == FALSE) {
      if (uVar23 != 0) {
        iVar6 = (int)uVar13 - (int)uVar8;
        do {
          write_audio_frame(e,1);
          iVar6 = iVar6 + 2;
        } while (iVar6 != 0);
        uVar8 = (e->state).ticks;
      }
      (e->state).apu.sync_ticks = uVar8;
    }
    else {
      if (uVar23 != 0) {
        do {
          if ((uVar13 & 0x1fff) == 0) {
            bVar7 = (e->state).apu.frame + 1 & 7;
            (e->state).apu.frame = bVar7;
            switch(bVar7) {
            case 2:
            case 6:
              if (((e->state).apu.channel[0].status != FALSE) &&
                 ((e->state).apu.sweep.enabled != FALSE)) {
                uVar3 = (e->state).apu.sweep.period;
                puVar1 = &(e->state).apu.sweep.timer;
                *puVar1 = *puVar1 + 0xff;
                if (*puVar1 == '\0') {
                  if (uVar3 == '\0') {
                    (e->state).apu.sweep.timer = '\b';
                  }
                  else {
                    (e->state).apu.sweep.timer = uVar3;
                    uVar18 = (e->state).apu.sweep.frequency;
                    SVar4 = (e->state).apu.sweep.direction;
                    if (SVar4 == SWEEP_DIRECTION_ADDITION) {
                      bVar7 = (e->state).apu.sweep.shift;
                      uVar14 = uVar18 >> (bVar7 & 0x1f);
                    }
                    else {
                      (e->state).apu.sweep.calculated_subtract = TRUE;
                      bVar7 = (e->state).apu.sweep.shift;
                      uVar14 = -(uVar18 >> (bVar7 & 0x1f));
                    }
                    uVar14 = uVar18 + uVar14;
                    if (uVar14 < 0x800) {
                      if (bVar7 != 0) {
                        (e->state).apu.channel[0].frequency = uVar14;
                        (e->state).apu.sweep.frequency = uVar14;
                        (e->state).apu.channel[0].square_wave.period =
                             (uint)(ushort)(uVar14 * -4 + 0x2000);
                        uVar18 = uVar14;
                      }
                      if (SVar4 == SWEEP_DIRECTION_ADDITION) {
                        uVar14 = uVar18 >> (bVar7 & 0x1f);
                      }
                      else {
                        (e->state).apu.sweep.calculated_subtract = TRUE;
                        uVar14 = -(uVar18 >> (bVar7 & 0x1f));
                      }
                      if ((ushort)(uVar18 + uVar14) < 0x800) goto switchD_00105dd9_caseD_0;
                    }
                    (e->state).apu.channel[0].status = FALSE;
                  }
                }
              }
            case 0:
            case 4:
switchD_00105dd9_caseD_0:
              lVar9 = 0;
              do {
                if (((*(int *)((long)&(e->state).apu.channel[0].length_enabled + lVar9) != 0) &&
                    (sVar10 = *(short *)((long)&(e->state).apu.channel[0].length + lVar9),
                    sVar10 != 0)) &&
                   (sVar10 = sVar10 + -1,
                   *(short *)((long)&(e->state).apu.channel[0].length + lVar9) = sVar10, sVar10 == 0
                   )) {
                  *(undefined4 *)((long)&(e->state).apu.channel[0].status + lVar9) = 0;
                }
                lVar9 = lVar9 + 0x40;
              } while (lVar9 != 0x100);
              break;
            case 7:
              lVar9 = 0;
              do {
                bVar7 = (&(e->state).apu.channel[0].envelope.period)[lVar9];
                if (bVar7 == 0) {
                  *(undefined4 *)((long)&(e->state).apu.channel[0].envelope.timer + lVar9) = 8;
                }
                else if (*(int *)((long)&(e->state).apu.channel[0].envelope.automatic + lVar9) != 0)
                {
                  piVar2 = (int *)((long)&(e->state).apu.channel[0].envelope.timer + lVar9);
                  *piVar2 = *piVar2 + -1;
                  if (*piVar2 == 0) {
                    *(uint *)((long)&(e->state).apu.channel[0].envelope.timer + lVar9) = (uint)bVar7
                    ;
                    bVar7 = (-(*(int *)((long)&(e->state).apu.channel[0].envelope.direction + lVar9)
                              == 0) | 1U) + (&(e->state).apu.channel[0].envelope.volume)[lVar9];
                    if (bVar7 < 0xf) {
                      (&(e->state).apu.channel[0].envelope.volume)[lVar9] = bVar7;
                    }
                    else {
                      *(undefined4 *)((long)&(e->state).apu.channel[0].envelope.automatic + lVar9) =
                           0;
                    }
                  }
                }
                lVar9 = lVar9 + 0x40;
              } while (lVar9 != 0x100);
            }
          }
          uVar8 = 0x2000 - (ulong)((uint)uVar13 & 0x1fff);
          if (uVar23 <= uVar8) {
            uVar8 = (ulong)uVar23;
          }
          if (1 < uVar8) {
            uVar20 = uVar8 >> 1 & 0x7fffffff;
            do {
              uVar5 = (e->audio_buffer).freq_counter;
              uVar12 = 0;
              if (uVar5 < 0x200000) {
                uVar12 = 0;
                do {
                  uVar5 = uVar5 + (e->audio_buffer).frequency;
                  uVar12 = uVar12 + 1;
                } while (uVar5 < 0x200000);
              }
              uVar5 = (uint)uVar20;
              if (uVar12 < uVar5) {
                uVar20 = (ulong)uVar12;
              }
              total_frames = (u32)uVar20;
              update_square_wave((e->state).apu.channel,total_frames);
              update_square_wave((e->state).apu.channel + 1,total_frames);
              if ((uVar12 != 0) && ((e->state).apu.channel[2].status != FALSE)) {
                iVar6 = (int)(e->state).apu.sync_ticks;
                bVar7 = (e->state).apu.wave.volume_shift;
                uVar15 = (e->state).apu.wave.ticks;
                bVar25 = (e->state).apu.wave.sample_data;
                uVar11 = (e->state).apu.channel[2].accumulator;
                uVar13 = uVar20;
                do {
                  uVar24 = uVar15 >> 1;
                  bVar22 = bVar25 >> (bVar7 & 0x1f);
                  uVar19 = (uint)uVar13;
                  if (uVar19 < uVar24) {
                    uVar16 = uVar19 * 2;
                    uVar15 = uVar15 + uVar19 * -2;
                    uVar24 = uVar19;
                  }
                  else {
                    bVar21 = (e->state).apu.wave.position + 1;
                    bVar25 = bVar21 & 0x1f;
                    (e->state).apu.wave.position = bVar25;
                    (e->state).apu.wave.sample_time = (ulong)(iVar6 + uVar15);
                    bVar26 = (e->state).apu.wave.ram[bVar25 >> 1];
                    bVar25 = bVar26 & 0xf;
                    if ((bVar21 & 1) == 0) {
                      bVar25 = bVar26 >> 4;
                    }
                    (e->state).apu.wave.sample_data = bVar25;
                    uVar16 = uVar15 & 0xfffffffe;
                    uVar15 = (e->state).apu.wave.period;
                  }
                  iVar6 = iVar6 + uVar16;
                  uVar11 = uVar11 + bVar22 * uVar24;
                  uVar13 = (ulong)(uVar19 - uVar24);
                } while (uVar19 - uVar24 != 0);
                (e->state).apu.wave.ticks = uVar15;
                (e->state).apu.channel[2].accumulator = uVar11;
              }
              if ((uVar12 != 0) && ((e->state).apu.channel[3].status != FALSE)) {
                bVar7 = (e->state).apu.channel[3].envelope.volume;
                bVar25 = (e->state).apu.noise.clock_shift;
                uVar11 = (e->state).apu.noise.ticks;
                uVar17 = (e->state).apu.channel[3].accumulator;
                bVar22 = (e->state).apu.noise.sample;
                do {
                  uVar15 = (uint)uVar20;
                  bVar26 = bVar22;
                  uVar12 = uVar15;
                  if (bVar25 < 0xe) {
                    uVar12 = uVar11 >> 1;
                    if (uVar15 < uVar12) {
                      uVar11 = uVar11 + uVar15 * -2;
                      uVar12 = uVar15;
                    }
                    else {
                      uVar18 = (e->state).apu.noise.lfsr;
                      uVar14 = uVar18 >> 1;
                      uVar11 = (e->state).apu.noise.period;
                      bVar28 = (e->state).apu.noise.lfsr_width != LFSR_WIDTH_7;
                      uVar27 = 0x3fff;
                      if (!bVar28) {
                        uVar27 = 0x7fbf;
                      }
                      (e->state).apu.noise.lfsr =
                           (short)(((uVar18 ^ uVar14) & 1) << (bVar28 << 3 | 6U)) +
                           (uVar27 & uVar14);
                      bVar26 = ~(byte)uVar14 & 1;
                      (e->state).apu.noise.sample = bVar26;
                    }
                    (e->state).apu.noise.ticks = uVar11;
                  }
                  uVar17 = uVar17 + (-bVar22 & bVar7) * uVar12;
                  uVar20 = (ulong)(uVar15 - uVar12);
                  bVar22 = bVar26;
                } while (uVar15 - uVar12 != 0);
                (e->state).apu.channel[3].accumulator = uVar17;
              }
              write_audio_frame(e,total_frames);
              uVar13 = (ulong)(total_frames * 2) + (e->state).apu.sync_ticks;
              (e->state).apu.sync_ticks = uVar13;
              uVar5 = uVar5 - total_frames;
              uVar20 = (ulong)uVar5;
            } while (uVar5 != 0);
          }
          local_48 = (int)uVar8;
          uVar23 = uVar23 - local_48;
        } while (uVar23 != 0);
        uVar8 = (e->state).ticks;
      }
      if (uVar13 != uVar8) {
        __assert_fail("APU.sync_ticks == TICKS",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                      ,0xf64,"void apu_synchronize(Emulator *)");
      }
    }
  }
  return;
}

Assistant:

static void apu_synchronize(Emulator* e) {
  if (TICKS > APU.sync_ticks) {
    u32 ticks = TICKS - APU.sync_ticks;
    if (APU.enabled) {
      apu_update(e, ticks);
      assert(APU.sync_ticks == TICKS);
    } else {
      for (; ticks; ticks -= APU_TICKS) {
        write_audio_frame(e, 1);
      }
      APU.sync_ticks = TICKS;
    }
  }
}